

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IStreamingReporter * __thiscall
Catch::ReporterRegistry::create(ReporterRegistry *this,string *name,Ptr<Catch::IConfig> *config)

{
  IReporterFactory *pIVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  undefined4 extraout_var;
  ReporterConfig local_48;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  Ptr<Catch::IConfig> *config_local;
  string *name_local;
  ReporterRegistry *this_local;
  
  it._M_node = (_Base_ptr)config;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
       ::find(&this->m_factories,name);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
       ::end(&this->m_factories);
  bVar2 = std::operator==(&local_30,&local_38);
  if (bVar2) {
    this_local = (ReporterRegistry *)0x0;
  }
  else {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
             ::operator->(&local_30);
    pIVar1 = ppVar4->second;
    ReporterConfig::ReporterConfig(&local_48,(Ptr<Catch::IConfig> *)it._M_node);
    iVar3 = (*pIVar1->_vptr_IReporterFactory[2])(pIVar1,&local_48);
    this_local = (ReporterRegistry *)CONCAT44(extraout_var,iVar3);
    ReporterConfig::~ReporterConfig(&local_48);
  }
  return (IStreamingReporter *)this_local;
}

Assistant:

virtual IStreamingReporter* create( std::string const& name, Ptr<IConfig> const& config ) const {
            FactoryMap::const_iterator it =  m_factories.find( name );
            if( it == m_factories.end() )
                return NULL;
            return it->second->create( ReporterConfig( config ) );
        }